

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O2

void __thiscall Nsf_Emu::Nsf_Emu(Nsf_Emu *this)

{
  (this->super_Nes_Cpu).state = &(this->super_Nes_Cpu).state_;
  Classic_Emu::Classic_Emu(&this->super_Classic_Emu);
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File._vptr_Gme_File =
       (_func_int **)&PTR__Nsf_Emu_007ed880;
  (this->rom).super_Rom_Data_.rom.begin_ = (uchar *)0x0;
  (this->rom).super_Rom_Data_.rom.size_ = 0;
  Nes_Apu::Nes_Apu(&this->apu);
  this->fme7 = (Nes_Fme7_Apu *)0x0;
  this->namco = (Nes_Namco_Apu *)0x0;
  this->vrc6 = (Nes_Vrc6_Apu *)0x0;
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.type_ = &gme_nsf_type_;
  (this->super_Classic_Emu).super_Music_Emu.silence_lookahead = 6;
  (this->apu).dmc.prg_reader_data = this;
  (this->apu).dmc.prg_reader = pcm_read;
  Music_Emu::set_equalizer((Music_Emu *)this,&nes_eq);
  (this->super_Classic_Emu).super_Music_Emu.gain_ = 1.4;
  memset(this->unmapped_code,0xf2,0x808);
  return;
}

Assistant:

Nsf_Emu::Nsf_Emu()
{
	vrc6  = 0;
	namco = 0;
	fme7  = 0;
	
	set_type( gme_nsf_type );
	set_silence_lookahead( 6 );
	apu.dmc_reader( pcm_read, this );
	Music_Emu::set_equalizer( nes_eq );
	set_gain( 1.4 );
	memset( unmapped_code, Nes_Cpu::bad_opcode, sizeof unmapped_code );
}